

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

string * __thiscall
cmCustomCommandGenerator::GetFullDepfile_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this)

{
  bool bVar1;
  string *a;
  string depfile;
  char local_59;
  string local_58;
  string local_38;
  
  GetDepfile_abi_cxx11_(&local_58,this);
  if (local_58._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_38);
  }
  else {
    bVar1 = cmsys::SystemTools::FileIsFullPath(&local_58);
    if (!bVar1) {
      a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LG);
      local_59 = '/';
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                (&local_38,a,&local_59,&local_58);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetFullDepfile() const
{
  std::string depfile = this->GetDepfile();
  if (depfile.empty()) {
    return "";
  }

  if (!cmSystemTools::FileIsFullPath(depfile)) {
    depfile = cmStrCat(this->LG->GetCurrentBinaryDirectory(), '/', depfile);
  }
  return cmSystemTools::CollapseFullPath(depfile);
}